

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_block_sequence_entry(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_parser_state_t *pyVar1;
  yaml_mark_t mark_00;
  int iVar2;
  yaml_mark_t *pyVar3;
  yaml_token_t *local_60;
  yaml_token_t *local_58;
  yaml_token_t *local_50;
  yaml_mark_t mark;
  yaml_token_t *token;
  int first_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (first != 0) {
    if ((parser->token_available == 0) &&
       (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
      local_50 = (yaml_token_t *)0x0;
    }
    else {
      local_50 = (parser->tokens).head;
    }
    if (((parser->marks).top == (parser->marks).end) &&
       (iVar2 = yaml_stack_extend(&(parser->marks).start,&(parser->marks).top,&(parser->marks).end),
       iVar2 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar3 = (parser->marks).top;
    (parser->marks).top = pyVar3 + 1;
    pyVar3->index = (local_50->start_mark).index;
    pyVar3->line = (local_50->start_mark).line;
    pyVar3->column = (local_50->start_mark).column;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
  }
  if ((parser->token_available == 0) && (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0))
  {
    local_58 = (yaml_token_t *)0x0;
  }
  else {
    local_58 = (parser->tokens).head;
  }
  if (local_58 == (yaml_token_t *)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (local_58->type == YAML_BLOCK_ENTRY_TOKEN) {
    mark_00 = local_58->end_mark;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    if ((parser->token_available == 0) &&
       (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
      local_60 = (yaml_token_t *)0x0;
    }
    else {
      local_60 = (parser->tokens).head;
    }
    if (local_60 == (yaml_token_t *)0x0) {
      parser_local._4_4_ = 0;
    }
    else if ((local_60->type == YAML_BLOCK_ENTRY_TOKEN) || (local_60->type == YAML_BLOCK_END_TOKEN))
    {
      parser->state = YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE;
      parser_local._4_4_ = yaml_parser_process_empty_scalar(parser,event,mark_00);
    }
    else if (((parser->states).top == (parser->states).end) &&
            (iVar2 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                       &(parser->states).end), iVar2 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      parser_local._4_4_ = 0;
    }
    else {
      pyVar1 = (parser->states).top;
      (parser->states).top = pyVar1 + 1;
      *pyVar1 = YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE;
      parser_local._4_4_ = yaml_parser_parse_node(parser,event,1,0);
    }
  }
  else if (local_58->type == YAML_BLOCK_END_TOKEN) {
    pyVar1 = (parser->states).top;
    (parser->states).top = pyVar1 + -1;
    parser->state = pyVar1[-1];
    (parser->marks).top = (parser->marks).top + -1;
    memset(event,0,0x68);
    event->type = YAML_SEQUENCE_END_EVENT;
    (event->start_mark).index = (local_58->start_mark).index;
    (event->start_mark).line = (local_58->start_mark).line;
    (event->start_mark).column = (local_58->start_mark).column;
    (event->end_mark).index = (local_58->end_mark).index;
    (event->end_mark).line = (local_58->end_mark).line;
    (event->end_mark).column = (local_58->end_mark).column;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    parser_local._4_4_ = 1;
  }
  else {
    pyVar3 = (parser->marks).top + -1;
    (parser->marks).top = pyVar3;
    parser_local._4_4_ =
         yaml_parser_set_parser_error_context
                   (parser,"while parsing a block collection",*pyVar3,
                    "did not find expected \'-\' indicator",local_58->start_mark);
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_parse_block_sequence_entry(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_BLOCK_ENTRY_TOKEN)
    {
        yaml_mark_t mark = token->end_mark;
        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) return 0;
        if (token->type != YAML_BLOCK_ENTRY_TOKEN &&
                token->type != YAML_BLOCK_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 1, 0);
        }
        else {
            parser->state = YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE;
            return yaml_parser_process_empty_scalar(parser, event, mark);
        }
    }

    else if (token->type == YAML_BLOCK_END_TOKEN)
    {
        parser->state = POP(parser, parser->states);
        (void)POP(parser, parser->marks);
        SEQUENCE_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

    else
    {
        return yaml_parser_set_parser_error_context(parser,
                "while parsing a block collection", POP(parser, parser->marks),
                "did not find expected '-' indicator", token->start_mark);
    }
}